

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O1

Gia_Man_t * Gia_ManReadMiniLut(char *pFileName)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  Mini_Lut_t *p;
  int *__ptr;
  uint *__ptr_00;
  Gia_Man_t *pGVar3;
  char *pcVar4;
  byte bVar5;
  size_t __n;
  size_t __n_00;
  int nSize;
  int local_34;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    p = (Mini_Lut_t *)0x0;
    printf("Cannot open file for reading \"%s\".\n");
  }
  else {
    fread(&local_34,4,1,__stream);
    p = (Mini_Lut_t *)calloc(1,0x20);
    p->nCap = local_34;
    p->nSize = local_34;
    fread(&p->nRegs,4,1,__stream);
    fread(&p->LutSize,4,1,__stream);
    iVar1 = p->nCap;
    iVar2 = p->LutSize;
    __n_00 = (size_t)(iVar2 * iVar1);
    __ptr = (int *)malloc(__n_00 * 4);
    bVar5 = (char)iVar2 - 5;
    if (iVar2 < 6) {
      bVar5 = 0;
    }
    p->pArray = __ptr;
    __n = (size_t)(iVar1 << (bVar5 & 0x1f));
    __ptr_00 = (uint *)malloc(__n * 4);
    p->pTruths = __ptr_00;
    fread(__ptr,4,__n_00,__stream);
    fread(__ptr_00,4,__n,__stream);
    fclose(__stream);
  }
  pGVar3 = Gia_ManFromMiniLut(p,(Vec_Int_t **)0x0);
  if (pGVar3->pName != (char *)0x0) {
    free(pGVar3->pName);
    pGVar3->pName = (char *)0x0;
  }
  pcVar4 = Extra_FileNameGeneric(pFileName);
  pGVar3->pName = pcVar4;
  Mini_LutStop(p);
  return pGVar3;
}

Assistant:

Gia_Man_t * Gia_ManReadMiniLut( char * pFileName )
{
    Mini_Lut_t * p = Mini_LutLoad( pFileName );
    Gia_Man_t * pGia = Gia_ManFromMiniLut( p, NULL );
    ABC_FREE( pGia->pName );
    pGia->pName = Extra_FileNameGeneric( pFileName ); 
    Mini_LutStop( p );
    return pGia;
}